

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int VmProcessLongOpt(jx9_value *pKey,jx9_value *pValue,void *pUserData)

{
  char *pB1;
  sxi32 sVar1;
  char *zName;
  long lVar2;
  char *pcVar3;
  ushort **ppuVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  sxu32 nSize;
  int nByte;
  int local_4c;
  int local_34;
  
  if ((pValue->iFlags & 1) != 0) {
    zName = jx9_value_to_string(pValue,&local_34);
    lVar2 = (long)local_34;
    if (0 < lVar2) {
      if (zName[lVar2 + -1] == ':') {
        pcVar3 = zName + lVar2;
        do {
          pcVar6 = pcVar3;
          pcVar3 = pcVar6 + -1;
          if (pcVar3 < zName) break;
        } while (*pcVar3 == ':');
        pcVar7 = pcVar3;
        if (zName < pcVar3) {
          *pcVar6 = '\0';
          pcVar7 = pcVar6;
        }
        local_34 = (int)pcVar7;
        local_4c = 1;
        if (pcVar3 <= zName) {
          return 0;
        }
      }
      else {
        local_34 = (int)zName + local_34;
        local_4c = 0;
      }
      pcVar3 = *(char **)((long)pUserData + 8);
      if (*pUserData < pcVar3) {
        nSize = local_34 - (int)zName;
        pcVar6 = *pUserData;
        do {
          if (((*pcVar6 == '-') && (pcVar6 + 1 < pcVar3)) && (pcVar6[1] == '-')) {
            pB1 = pcVar6 + 2;
            pcVar7 = pB1;
            if (pB1 < pcVar3) {
              ppuVar4 = __ctype_b_loc();
              pcVar5 = pcVar3 + (-2 - (long)pcVar6);
              pcVar6 = pB1;
              do {
                pcVar7 = pcVar6;
                if (((long)*pcVar6 == 0x3d) || (((*ppuVar4)[*pcVar6] & 0x2000) != 0)) break;
                pcVar6 = pcVar6 + 1;
                pcVar5 = pcVar5 + -1;
                pcVar7 = pcVar3;
              } while (pcVar5 != (char *)0x0);
            }
            if (((int)pcVar7 - (int)pB1 == nSize) && (sVar1 = SyMemcmp(pB1,zName,nSize), sVar1 == 0)
               ) goto LAB_0012dc42;
          }
          else {
            pcVar7 = pcVar6 + 1;
          }
          pcVar6 = pcVar7;
        } while (pcVar7 < pcVar3);
      }
      pcVar7 = (char *)0x0;
LAB_0012dc42:
      if (pcVar7 != (char *)0x0) {
        VmExtractOptArgValue
                  (*(jx9_value **)((long)pUserData + 0x18),*(jx9_value **)((long)pUserData + 0x10),
                   pcVar7,pcVar3,local_4c,*(jx9_context **)((long)pUserData + 0x20),zName);
      }
    }
  }
  return 0;
}

Assistant:

static int VmProcessLongOpt(jx9_value *pKey, jx9_value *pValue, void *pUserData)
{
	struct getopt_long_opt *pOpt = (struct getopt_long_opt *)pUserData;
	const char *zArg, *zOpt, *zEnd;
	int need_value = 0;
	int nByte;
	/* Value must be of type string */
	if( !jx9_value_is_string(pValue) ){
		/* Simply ignore */
		return JX9_OK;
	}
	zOpt = jx9_value_to_string(pValue, &nByte);
	if( nByte < 1 ){
		/* Empty string, ignore */
		return JX9_OK;
	}
	zEnd = &zOpt[nByte - 1];
	if( zEnd[0] == ':' ){
		char *zTerm;
		/* Try to extract a value */
		need_value = 1;
		while( zEnd >= zOpt && zEnd[0] == ':' ){
			zEnd--;
		}
		if( zOpt >= zEnd ){
			/* Empty string, ignore */
			SXUNUSED(pKey);
			return JX9_OK;
		}
		zEnd++;
		zTerm = (char *)zEnd;
		zTerm[0] = 0;
	}else{
		zEnd = &zOpt[nByte];
	}
	/* Find the option */
	zArg = VmFindLongOpt(zOpt, (int)(zEnd-zOpt), pOpt->zArgIn, pOpt->zArgEnd);
	if( zArg == 0 ){
		/* No such option, return immediately */
		return JX9_OK;
	}
	/* Try to extract a value */
	VmExtractOptArgValue(pOpt->pArray, pOpt->pWorker, zArg, pOpt->zArgEnd, need_value, pOpt->pCtx, zOpt);
	return JX9_OK;
}